

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOMPI.cpp
# Opt level: O1

shared_ptr<adios2::core::Engine> __thiscall
adios2::core::anon_unknown_4::MakeEngineMPI<adios2::core::engine::SscWriter>
          (anon_unknown_4 *this,IO *io,string *name,Mode mode,Comm *comm)

{
  size_type sVar1;
  char cVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<adios2::core::Engine> sVar3;
  Comm local_c0 [8];
  string local_b8;
  string local_90;
  string local_70;
  string local_50;
  
  cVar2 = adios2::helper::Comm::IsMPI();
  if (cVar2 == '\0') {
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Core","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"IOMPI","");
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"MakeEngineMPI","");
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,
               "A MPI-only engine cannot be used with a communicator that is not MPI-based.","");
    helper::Throw<std::invalid_argument>(&local_b8,&local_70,&local_90,&local_50,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
  }
  adios2::helper::Comm::Comm(local_c0,comm);
  local_70._M_dataplus._M_p._0_4_ = mode;
  local_b8._M_dataplus._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<adios2::core::engine::SscWriter,std::allocator<adios2::core::engine::SscWriter>,adios2::core::IO&,std::__cxx11::string_const&,adios2::Mode_const&,adios2::helper::Comm>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b8._M_string_length,
             (SscWriter **)&local_b8,(allocator<adios2::core::engine::SscWriter> *)&local_90,io,name
             ,(Mode *)&local_70,local_c0);
  sVar1 = local_b8._M_string_length;
  *(undefined8 *)(this + 8) = 0;
  local_b8._M_string_length = 0;
  *(pointer *)this = local_b8._M_dataplus._M_p;
  *(size_type *)(this + 8) = sVar1;
  adios2::helper::Comm::~Comm(local_c0);
  sVar3.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<adios2::core::Engine>)
         sVar3.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Engine> MakeEngineMPI(IO &io, const std::string &name, const Mode mode,
                                      helper::Comm comm)
{
    if (!comm.IsMPI())
    {
        helper::Throw<std::invalid_argument>("Core", "IOMPI", "MakeEngineMPI",
                                             "A MPI-only engine cannot be used with a "
                                             "communicator that is not MPI-based.");
    }
    return IO::MakeEngine<T>(io, name, mode, std::move(comm));
}